

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.hpp
# Opt level: O1

void __thiscall beast::unit_test::detail::reporter<void>::reporter(reporter<void> *this,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  rep rVar2;
  char *local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  char *local_40;
  size_type local_38;
  char local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  (this->super_runner).arg_._M_dataplus._M_p = (pointer)&(this->super_runner).arg_.field_2;
  (this->super_runner).arg_._M_string_length = 0;
  (this->super_runner).arg_.field_2._M_local_buf[0] = '\0';
  (this->super_runner).default_ = false;
  (this->super_runner).failed_ = false;
  (this->super_runner).cond_ = false;
  *(undefined8 *)((long)&(this->super_runner).mutex_.super___recursive_mutex_base._M_mutex + 0x10) =
       0;
  (this->super_runner).mutex_.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_runner).mutex_.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_runner).mutex_.super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->super_runner).mutex_.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->super_runner).mutex_.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (this->super_runner)._vptr_runner = (_func_int **)&PTR__reporter_002d6340;
  this->os_ = os;
  (this->results_).suites = 0;
  (this->results_).cases = 0;
  (this->results_).total = 0;
  (this->results_).failed = 0;
  (this->results_).top.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->results_).top.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->results_).top.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rVar2 = ::std::chrono::_V2::steady_clock::now();
  (this->results_).start.__d.__r = rVar2;
  local_60 = &local_50;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  paVar1 = &(this->suite_results_).name.field_2;
  (this->suite_results_).name._M_dataplus._M_p = (pointer)paVar1;
  if (local_60 == &local_50) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    *(undefined8 *)((long)&(this->suite_results_).name.field_2 + 8) = uStack_48;
  }
  else {
    (this->suite_results_).name._M_dataplus._M_p = local_60;
    (this->suite_results_).name.field_2._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
  }
  (this->suite_results_).name._M_string_length = local_58;
  local_58 = 0;
  local_50 = '\0';
  (this->suite_results_).failed = 0;
  (this->suite_results_).cases = 0;
  (this->suite_results_).total = 0;
  local_60 = &local_50;
  rVar2 = ::std::chrono::_V2::steady_clock::now();
  (this->suite_results_).start.__d.__r = rVar2;
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  local_40 = &local_30;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  paVar1 = &(this->case_results_).name.field_2;
  (this->case_results_).name._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    *(undefined8 *)((long)&(this->case_results_).name.field_2 + 8) = uStack_28;
  }
  else {
    (this->case_results_).name._M_dataplus._M_p = local_40;
    (this->case_results_).name.field_2._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
  }
  (this->case_results_).name._M_string_length = local_38;
  (this->case_results_).total = 0;
  (this->case_results_).failed = 0;
  return;
}

Assistant:

reporter<_>::
reporter(std::ostream& os)
    : os_(os)
{
}